

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O3

Vec_Int_t * Nwk_ManLutMerge(Nwk_Man_t *pNtk,void *pParsInit)

{
  uint uVar1;
  void *pvVar2;
  Nwk_Obj_t *pLut;
  Vec_Int_t *pVVar3;
  int iVar4;
  long lVar5;
  Nwk_Grf_t *pNVar6;
  Vec_Ptr_t *pVVar7;
  void **ppvVar8;
  void **ppvVar9;
  Vec_Ptr_t *vCands;
  Vec_Ptr_t *pVVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  timespec ts;
  uint local_94;
  timespec local_80;
  uint local_6c;
  Vec_Ptr_t *local_68;
  Vec_Ptr_t *local_60;
  Vec_Ptr_t *local_58;
  long local_50;
  Nwk_Grf_t *local_48;
  long local_40;
  Nwk_LMPars_t *local_38;
  
  iVar4 = clock_gettime(3,&local_80);
  if (iVar4 < 0) {
    lVar12 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_80.tv_nsec),8);
    lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_80.tv_sec * -1000000;
  }
  lVar5 = (long)pNtk->vObjs->nSize;
  local_94 = 0;
  iVar4 = 0;
  if (0 < lVar5) {
    lVar13 = 0;
    iVar4 = 0;
    do {
      pvVar2 = pNtk->vObjs->pArray[lVar13];
      if ((pvVar2 != (void *)0x0) && ((*(uint *)((long)pvVar2 + 0x20) & 7) == 3)) {
        iVar4 = iVar4 + (uint)(*(int *)((long)pvVar2 + 0x3c) <= *pParsInit);
      }
      lVar13 = lVar13 + 1;
    } while (lVar5 != lVar13);
  }
  pNVar6 = Nwk_ManGraphAlloc(iVar4);
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  pVVar7->nCap = 1000;
  pVVar7->nSize = 0;
  ppvVar8 = (void **)malloc(8000);
  pVVar7->pArray = ppvVar8;
  local_60 = pVVar7;
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  pVVar7->nCap = 1000;
  pVVar7->nSize = 0;
  ppvVar9 = (void **)malloc(8000);
  pVVar7->pArray = ppvVar9;
  local_58 = pVVar7;
  vCands = (Vec_Ptr_t *)malloc(0x10);
  vCands->nCap = 1000;
  vCands->nSize = 0;
  ppvVar9 = (void **)malloc(8000);
  vCands->pArray = ppvVar9;
  pVVar10 = (Vec_Ptr_t *)malloc(0x10);
  pVVar10->nCap = 1000;
  pVVar10->nSize = 0;
  ppvVar9 = (void **)malloc(8000);
  pVVar10->pArray = ppvVar9;
  pVVar7 = pNtk->vObjs;
  local_68 = pVVar10;
  if (0 < pVVar7->nSize) {
    uVar15 = 0;
    lVar5 = 0;
    local_94 = 0;
    local_48 = pNVar6;
    local_40 = lVar12;
    local_38 = (Nwk_LMPars_t *)pParsInit;
    do {
      pLut = (Nwk_Obj_t *)pVVar7->pArray[lVar5];
      if (((pLut != (Nwk_Obj_t *)0x0) && ((*(uint *)&pLut->field_0x20 & 7) == 3)) &&
         (pLut->nFanins <= ((Nwk_LMPars_t *)pParsInit)->nMaxLutSize)) {
        Nwk_ManCollectOverlapCands(pLut,vCands,(Nwk_LMPars_t *)pParsInit);
        pVVar7 = local_68;
        if (((Nwk_LMPars_t *)pParsInit)->fUseDiffSupp != 0) {
          Nwk_ManCollectNonOverlapCands(pLut,local_60,local_58,local_68,(Nwk_LMPars_t *)pParsInit);
          uVar15 = pVVar7->nSize;
        }
        uVar1 = vCands->nSize;
        uVar11 = (ulong)uVar1;
        if (uVar11 == 0) {
          if (uVar15 == 0) {
            uVar15 = 0;
            goto LAB_004f0c5d;
          }
        }
        else {
          local_94 = local_94 + uVar1;
          if (0 < (int)uVar1) {
            ppvVar8 = vCands->pArray;
            uVar16 = 0;
            local_50 = lVar5;
            do {
              Nwk_ManGraphHashEdge(pNVar6,pLut->Id,*(int *)((long)ppvVar8[uVar16] + 0x24));
              uVar16 = uVar16 + 1;
              lVar5 = local_50;
            } while (uVar11 != uVar16);
          }
        }
        local_50 = lVar5;
        pNVar6 = local_48;
        local_6c = uVar15;
        if (0 < (int)uVar15) {
          ppvVar8 = local_68->pArray;
          uVar16 = 0;
          do {
            Nwk_ManGraphHashEdge(pNVar6,pLut->Id,*(int *)((long)ppvVar8[uVar16] + 0x24));
            uVar16 = uVar16 + 1;
          } while (uVar15 != uVar16);
        }
        pParsInit = local_38;
        uVar15 = local_6c;
        local_94 = local_94 + local_6c;
        lVar5 = local_50;
        pNVar6 = local_48;
        if (local_38->fVeryVerbose != 0) {
          printf("Node %6d : Fanins = %d. Fanouts = %3d.  Cand1 = %3d. Cand2 = %3d.\n",
                 (ulong)(uint)pLut->Id,(ulong)(uint)pLut->nFanins,(ulong)(uint)pLut->nFanins,uVar11,
                 (ulong)local_6c);
          lVar5 = local_50;
          pNVar6 = local_48;
        }
      }
LAB_004f0c5d:
      lVar5 = lVar5 + 1;
      pVVar7 = pNtk->vObjs;
    } while (lVar5 < pVVar7->nSize);
    ppvVar8 = local_60->pArray;
    lVar12 = local_40;
  }
  if (ppvVar8 != (void **)0x0) {
    free(ppvVar8);
  }
  free(local_60);
  if (local_58->pArray != (void **)0x0) {
    free(local_58->pArray);
  }
  free(local_58);
  if (vCands->pArray != (void **)0x0) {
    free(vCands->pArray);
  }
  free(vCands);
  if (local_68->pArray != (void **)0x0) {
    free(local_68->pArray);
  }
  free(local_68);
  if (((Nwk_LMPars_t *)pParsInit)->fVerbose != 0) {
    iVar4 = 0x99bae9;
    printf("Mergable LUTs = %6d. Total cands = %6d. ",(ulong)(uint)pNVar6->nVertsMax,(ulong)local_94
          );
    Abc_Print(iVar4,"%s =","Deriving graph");
    iVar14 = 3;
    iVar4 = clock_gettime(3,&local_80);
    if (iVar4 < 0) {
      lVar5 = -1;
    }
    else {
      lVar5 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
    }
    Abc_Print(iVar14,"%9.2f sec\n",(double)(lVar5 + lVar12) / 1000000.0);
  }
  iVar4 = clock_gettime(3,&local_80);
  if (iVar4 < 0) {
    lVar12 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_80.tv_nsec),8);
    lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + local_80.tv_sec * -1000000;
  }
  Nwk_ManGraphSolve(pNVar6);
  if (((Nwk_LMPars_t *)pParsInit)->fVerbose != 0) {
    iVar4 = 0x99bb21;
    printf("GRAPH: Nodes = %6d. Edges = %6d.  Pairs = %6d.  ",(ulong)(uint)pNVar6->nVerts,
           (ulong)(uint)pNVar6->nEdges,(ulong)(uint)(pNVar6->vPairs->nSize / 2));
    Abc_Print(iVar4,"%s =","Solving");
    iVar14 = 3;
    iVar4 = clock_gettime(3,&local_80);
    if (iVar4 < 0) {
      lVar5 = -1;
    }
    else {
      lVar5 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
    }
    Abc_Print(iVar14,"%9.2f sec\n",(double)(lVar5 + lVar12) / 1000000.0);
    Nwk_ManGraphReportMemoryUsage(pNVar6);
  }
  pVVar3 = pNVar6->vPairs;
  pNVar6->vPairs = (Vec_Int_t *)0x0;
  Nwk_ManGraphFree(pNVar6);
  return pVVar3;
}

Assistant:

Vec_Int_t * Nwk_ManLutMerge( Nwk_Man_t * pNtk, void * pParsInit )
{
    Nwk_LMPars_t * pPars = (Nwk_LMPars_t *)pParsInit;
    Nwk_Grf_t * p;
    Vec_Int_t * vResult;
    Vec_Ptr_t * vStart, * vNext, * vCands1, * vCands2;
    Nwk_Obj_t * pLut, * pCand;
    int i, k, nVertsMax, nCands;
    abctime clk = Abc_Clock();
    // count the number of vertices
    nVertsMax = 0;
    Nwk_ManForEachNode( pNtk, pLut, i )
        nVertsMax += (int)(Nwk_ObjFaninNum(pLut) <= pPars->nMaxLutSize);
    p = Nwk_ManGraphAlloc( nVertsMax );
    // create graph
    vStart  = Vec_PtrAlloc( 1000 );
    vNext   = Vec_PtrAlloc( 1000 );
    vCands1 = Vec_PtrAlloc( 1000 );
    vCands2 = Vec_PtrAlloc( 1000 );
    nCands  = 0;
    Nwk_ManForEachNode( pNtk, pLut, i )
    {
        if ( Nwk_ObjFaninNum(pLut) > pPars->nMaxLutSize )
            continue;
        Nwk_ManCollectOverlapCands( pLut, vCands1, pPars );
        if ( pPars->fUseDiffSupp )
            Nwk_ManCollectNonOverlapCands( pLut, vStart, vNext, vCands2, pPars );
        if ( Vec_PtrSize(vCands1) == 0 && Vec_PtrSize(vCands2) == 0 )
            continue;
        nCands += Vec_PtrSize(vCands1) + Vec_PtrSize(vCands2);
        // save candidates
        Vec_PtrForEachEntry( Nwk_Obj_t *, vCands1, pCand, k )
            Nwk_ManGraphHashEdge( p, Nwk_ObjId(pLut), Nwk_ObjId(pCand) );
        Vec_PtrForEachEntry( Nwk_Obj_t *, vCands2, pCand, k )
            Nwk_ManGraphHashEdge( p, Nwk_ObjId(pLut), Nwk_ObjId(pCand) );
        // print statistics about this node
        if ( pPars->fVeryVerbose )
        printf( "Node %6d : Fanins = %d. Fanouts = %3d.  Cand1 = %3d. Cand2 = %3d.\n",
            Nwk_ObjId(pLut), Nwk_ObjFaninNum(pLut), Nwk_ObjFaninNum(pLut), 
            Vec_PtrSize(vCands1), Vec_PtrSize(vCands2) );
    }
    Vec_PtrFree( vStart );
    Vec_PtrFree( vNext );
    Vec_PtrFree( vCands1 );
    Vec_PtrFree( vCands2 );
    if ( pPars->fVerbose )
    {
        printf( "Mergable LUTs = %6d. Total cands = %6d. ", p->nVertsMax, nCands );
        ABC_PRT( "Deriving graph", Abc_Clock() - clk );
    }
    // solve the graph problem
    clk = Abc_Clock();
    Nwk_ManGraphSolve( p );
    if ( pPars->fVerbose )
    {
        printf( "GRAPH: Nodes = %6d. Edges = %6d.  Pairs = %6d.  ", 
            p->nVerts, p->nEdges, Vec_IntSize(p->vPairs)/2 );
        ABC_PRT( "Solving", Abc_Clock() - clk );
        Nwk_ManGraphReportMemoryUsage( p );
    }
    vResult = p->vPairs; p->vPairs = NULL;
/*
    for ( i = 0; i < vResult->nSize; i += 2 )
        printf( "(%d,%d) ", vResult->pArray[i], vResult->pArray[i+1] );
    printf( "\n" );
*/
    Nwk_ManGraphFree( p );
    return vResult;
}